

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O3

void __thiscall
spv::Function::Function
          (Function *this,Id id,Id resultType,Id functionType,Id firstParamId,Module *parent)

{
  Vector<Id> *this_00;
  pointer *pppIVar1;
  Id IVar2;
  iterator __position;
  Instruction *pIVar3;
  iterator __position_00;
  ulong uVar4;
  int iVar5;
  Instruction *param;
  Instruction *local_48;
  vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>> *local_40;
  Vector<Id> *local_38;
  
  this->_vptr_Function = (_func_int **)&PTR__Function_001f3d68;
  this->parent = parent;
  (this->functionInstruction)._vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  (this->functionInstruction).resultId = id;
  (this->functionInstruction).typeId = resultType;
  (this->functionInstruction).opCode = OpFunction;
  this_00 = &(this->functionInstruction).operands;
  local_40 = (vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>> *)
             &this->parameterInstructions;
  (this->functionInstruction).operands.
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->functionInstruction).operands.
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->functionInstruction).operands.
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->functionInstruction).block = (Block *)0x0;
  (this->parameterInstructions).
  super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parameterInstructions).
  super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parameterInstructions).
  super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->blocks).super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blocks).super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->blocks).super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->implicitThis = false;
  local_48 = (Instruction *)((ulong)local_48 & 0xffffffff00000000);
  local_38 = this_00;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,
             (iterator)0x0,(uint *)&local_48);
  __position._M_current =
       (this->functionInstruction).operands.
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48 = (Instruction *)CONCAT44(local_48._4_4_,functionType);
  if (__position._M_current ==
      (this->functionInstruction).operands.
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,
               __position,(uint *)&local_48);
  }
  else {
    *__position._M_current = functionType;
    (this->functionInstruction).operands.
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  Module::mapInstruction(parent,&this->functionInstruction);
  Module::addFunction(parent,this);
  pIVar3 = (parent->idToInstruction).
           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start[functionType];
  iVar5 = (int)((ulong)((long)*(pointer *)
                               ((long)&(pIVar3->operands).
                                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                       ._M_impl + 8) -
                       *(long *)&(pIVar3->operands).
                                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                 ._M_impl.super__Vector_impl_data) >> 2);
  if (1 < iVar5) {
    uVar4 = 0;
    do {
      local_48 = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
      IVar2 = *(Id *)(*(long *)&(pIVar3->operands).
                                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                ._M_impl.super__Vector_impl_data + 4 + uVar4 * 4);
      local_48->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
      local_48->resultId = (int)uVar4 + firstParamId;
      local_48->typeId = IVar2;
      local_48->opCode = OpFunctionParameter;
      (local_48->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_48->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_48->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48->block = (Block *)0x0;
      Module::mapInstruction(parent,local_48);
      __position_00._M_current =
           (this->parameterInstructions).
           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->parameterInstructions).
          super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>>::
        _M_realloc_insert<spv::Instruction*const&>(local_40,__position_00,&local_48);
      }
      else {
        *__position_00._M_current = local_48;
        pppIVar1 = &(this->parameterInstructions).
                    super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppIVar1 = *pppIVar1 + 1;
      }
      uVar4 = uVar4 + 1;
    } while (iVar5 - 1 != uVar4);
  }
  return;
}

Assistant:

__inline Function::Function(Id id, Id resultType, Id functionType, Id firstParamId, Module& parent)
    : parent(parent), functionInstruction(id, resultType, OpFunction), implicitThis(false)
{
    // OpFunction
    functionInstruction.addImmediateOperand(FunctionControlMaskNone);
    functionInstruction.addIdOperand(functionType);
    parent.mapInstruction(&functionInstruction);
    parent.addFunction(this);

    // OpFunctionParameter
    Instruction* typeInst = parent.getInstruction(functionType);
    int numParams = typeInst->getNumOperands() - 1;
    for (int p = 0; p < numParams; ++p) {
        Instruction* param = new Instruction(firstParamId + p, typeInst->getIdOperand(p + 1), OpFunctionParameter);
        parent.mapInstruction(param);
        parameterInstructions.push_back(param);
    }
}